

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

void __thiscall iutest::detail::ParamTestSuiteHolder::RegisterTests(ParamTestSuiteHolder *this)

{
  pointer ppIVar1;
  
  for (ppIVar1 = (this->m_testsuite_infos).
                 super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar1 !=
      (this->m_testsuite_infos).
      super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppIVar1 = ppIVar1 + 1) {
    IParamTestSuiteInfo::RegisterTests(*ppIVar1);
  }
  return;
}

Assistant:

void RegisterTests() const
    {
        for( TestSuiteInfoContainer::const_iterator it = m_testsuite_infos.begin(); it != m_testsuite_infos.end(); ++it)
        {
            (*it)->RegisterTests();
        }
    }